

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool CoreML::isIOS12NeuralNetworkLayer(NeuralNetworkLayer *layer)

{
  bool bVar1;
  LayerCase LVar2;
  UpsampleLayerParams_LinearUpsampleMode UVar3;
  int iVar4;
  ReorganizeDataLayerParams_ReorganizationType RVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  InnerProductLayerParams *this_00;
  UpsampleLayerParams *pUVar6;
  ReorganizeDataLayerParams *this_01;
  NeuralNetworkLayer *layer_local;
  
  LVar2 = Specification::NeuralNetworkLayer::layer_case(layer);
  if (LVar2 == kConvolution) {
    this = Specification::NeuralNetworkLayer::input_abi_cxx11_(layer);
    iVar4 = google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::size(this);
    return iVar4 == 1;
  }
  if ((LVar2 != kPooling) && (LVar2 != kActivation)) {
    if (LVar2 == kInnerProduct) {
      this_00 = Specification::NeuralNetworkLayer::innerproduct(layer);
      bVar1 = Specification::InnerProductLayerParams::int8dynamicquantize(this_00);
      return (bool)((bVar1 ^ 0xffU) & 1);
    }
    if (LVar2 == kEmbedding) goto LAB_00356c54;
    if (LVar2 != kBatchnorm) {
      if ((LVar2 == kMvn) || (LVar2 == kL2Normalize)) goto LAB_00356c54;
      if ((LVar2 != kSoftmax) && (LVar2 != kLrn)) {
        if (LVar2 == kCrop) goto LAB_00356c54;
        if ((LVar2 != kPadding) && (LVar2 != kUpsample)) {
          if (LVar2 - kResizeBilinear < 2) {
            return true;
          }
          if ((LVar2 != kUnary) && (1 < LVar2 - kAdd)) {
            if (((LVar2 == kAverage) ||
                (((LVar2 == kScale || (LVar2 == kBias)) || (LVar2 - kMax < 2)))) ||
               ((((LVar2 == kDot || (LVar2 == kReduce)) || (LVar2 == kLoadConstant)) ||
                ((LVar2 - kReshape < 2 || (LVar2 == kPermute)))))) goto LAB_00356c54;
            if ((LVar2 != kConcat) && (LVar2 != kSplit)) {
              if ((LVar2 != kSequenceRepeat) && (LVar2 != kReorganizeData)) {
                if (LVar2 == kSlice) {
                  return true;
                }
                if ((((LVar2 != kSimpleRecurrent) && (LVar2 != kGru)) &&
                    (LVar2 != kUniDirectionalLSTM)) && (LVar2 != kBiDirectionalLSTM)) {
                  if (LVar2 == kCustom) {
                    return true;
                  }
                  return false;
                }
              }
              goto LAB_00356c54;
            }
          }
        }
      }
    }
  }
  pUVar6 = Specification::NeuralNetworkLayer::upsample(layer);
  UVar3 = Specification::UpsampleLayerParams::linearupsamplemode(pUVar6);
  if (UVar3 != UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
    return false;
  }
  pUVar6 = Specification::NeuralNetworkLayer::upsample(layer);
  iVar4 = Specification::UpsampleLayerParams::fractionalscalingfactor_size(pUVar6);
  if (0 < iVar4) {
    return false;
  }
LAB_00356c54:
  this_01 = Specification::NeuralNetworkLayer::reorganizedata(layer);
  RVar5 = Specification::ReorganizeDataLayerParams::mode(this_01);
  if (RVar5 != ReorganizeDataLayerParams_ReorganizationType_PIXEL_SHUFFLE) {
    return true;
  }
  return false;
}

Assistant:

bool CoreML::isIOS12NeuralNetworkLayer(const Specification::NeuralNetworkLayer& layer) {

    // Return True if the NN layer is from the set exposed in iOS 12
    switch (layer.layer_case()) {
        case Specification::NeuralNetworkLayer::LayerCase::kConvolution:
            return (layer.input().size() == 1);
        case Specification::NeuralNetworkLayer::LayerCase::kInnerProduct:
            return !layer.innerproduct().int8dynamicquantize();
        case Specification::NeuralNetworkLayer::LayerCase::kBatchnorm:
        case Specification::NeuralNetworkLayer::LayerCase::kActivation:
        case Specification::NeuralNetworkLayer::LayerCase::kPooling:
        case Specification::NeuralNetworkLayer::LayerCase::kPadding:
        case Specification::NeuralNetworkLayer::LayerCase::kConcat:
        case Specification::NeuralNetworkLayer::LayerCase::kLrn:
        case Specification::NeuralNetworkLayer::LayerCase::kSoftmax:
        case Specification::NeuralNetworkLayer::LayerCase::kSplit:
        case Specification::NeuralNetworkLayer::LayerCase::kAdd:
        case Specification::NeuralNetworkLayer::LayerCase::kMultiply:
        case Specification::NeuralNetworkLayer::LayerCase::kUnary:
        case Specification::NeuralNetworkLayer::LayerCase::kUpsample:
            if (layer.upsample().linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
                return false;
            }
            if (layer.upsample().fractionalscalingfactor_size() > 0) {
                return false;
            }
        case Specification::NeuralNetworkLayer::LayerCase::kBias:
        case Specification::NeuralNetworkLayer::LayerCase::kL2Normalize:
        case Specification::NeuralNetworkLayer::LayerCase::kReshape:
        case Specification::NeuralNetworkLayer::LayerCase::kFlatten:
        case Specification::NeuralNetworkLayer::LayerCase::kPermute:
        case Specification::NeuralNetworkLayer::LayerCase::kReduce:
        case Specification::NeuralNetworkLayer::LayerCase::kLoadConstant:
        case Specification::NeuralNetworkLayer::LayerCase::kScale:
        case Specification::NeuralNetworkLayer::LayerCase::kSimpleRecurrent:
        case Specification::NeuralNetworkLayer::LayerCase::kGru:
        case Specification::NeuralNetworkLayer::LayerCase::kUniDirectionalLSTM:
        case Specification::NeuralNetworkLayer::LayerCase::kBiDirectionalLSTM:
        case Specification::NeuralNetworkLayer::LayerCase::kCrop:
        case Specification::NeuralNetworkLayer::LayerCase::kAverage:
        case Specification::NeuralNetworkLayer::LayerCase::kMax:
        case Specification::NeuralNetworkLayer::LayerCase::kMin:
        case Specification::NeuralNetworkLayer::LayerCase::kDot:
        case Specification::NeuralNetworkLayer::LayerCase::kMvn:
        case Specification::NeuralNetworkLayer::LayerCase::kEmbedding:
        case Specification::NeuralNetworkLayer::LayerCase::kSequenceRepeat:
        case Specification::NeuralNetworkLayer::LayerCase::kReorganizeData:
            if (layer.reorganizedata().mode() == Specification::ReorganizeDataLayerParams::PIXEL_SHUFFLE) {
                      return false;
            }
        case Specification::NeuralNetworkLayer::LayerCase::kSlice:
        case Specification::NeuralNetworkLayer::LayerCase::kCustom:
        case Specification::NeuralNetworkLayer::kResizeBilinear:
        case Specification::NeuralNetworkLayer::kCropResize:
            return true;
        default:
            return false;
    }
}